

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

void __thiscall lsim::Simulator::clear_components(Simulator *this)

{
  Simulator *this_local;
  
  std::
  vector<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
  ::clear(&this->m_components);
  std::vector<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>::clear
            (&this->m_init_components);
  std::vector<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>::clear
            (&this->m_independent_components);
  clear_pins(this);
  clear_nodes(this);
  return;
}

Assistant:

void Simulator::clear_components() {
    m_components.clear();
    m_init_components.clear();
    m_independent_components.clear();
    clear_pins();
    clear_nodes();
}